

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QDBusObjectPath>>
          (QtPrivate *this,QDebug debug,char *which,QList<QDBusObjectPath> *c)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  QDebug *pQVar5;
  QDBusObjectPath *pQVar6;
  QDBusObjectPath *this_00;
  QDBusObjectPath *pQVar7;
  long in_FS_OFFSET;
  undefined1 local_60 [32];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar5 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar5,'(');
  pQVar7 = (c->d).ptr;
  lVar2 = (c->d).size;
  pQVar6 = pQVar7 + lVar2;
  if (lVar2 == 0) goto LAB_001085e7;
  local_60._16_8_ = *(undefined8 *)debug.stream;
  this_00 = (QDBusObjectPath *)(local_60 + 0x10);
  *(int *)(local_60._16_8_ + 0x28) = *(int *)(local_60._16_8_ + 0x28) + 1;
  puVar4 = local_60 + 0x10;
  while( true ) {
    operator<<((Stream *)(puVar4 + 8),this_00);
    QDebug::~QDebug((QDebug *)(puVar4 + 8));
    QDebug::~QDebug((QDebug *)this_00);
    pQVar7 = pQVar7 + 1;
LAB_001085e7:
    if (pQVar7 == pQVar6) break;
    pQVar5 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60._0_8_ = pQVar5->stream;
    this_00 = (QDBusObjectPath *)local_60;
    *(int *)(local_60._0_8_ + 0x28) = *(int *)(local_60._0_8_ + 0x28) + 1;
    puVar4 = local_60;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}